

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O2

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::reset(Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
        *this)

{
  long *plVar1;
  BacktrackData *pBVar2;
  BacktrackObject *in_RAX;
  BacktrackData local_18;
  
  (this->_svStack)._cursor = (this->_svStack)._stack;
  local_18._boList = in_RAX;
  Lib::
  Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>_>
  ::reset(&this->_nodeIterators);
  (this->_bdStack)._cursor = (this->_bdStack)._stack;
  if (this->_normalizationRecording == true) {
    plVar1 = (long *)((long)(this->_algo)._unif._subs._self._M_t.
                            super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
                            ._M_t + 0x10);
    *plVar1 = *plVar1 + -8;
    this->_normalizationRecording = false;
    Lib::BacktrackData::backtrack(&this->_normalizationBacktrackData);
  }
  while (pBVar2 = (this->_bdStack)._cursor, pBVar2 != (this->_bdStack)._stack) {
    (this->_bdStack)._cursor = pBVar2 + -1;
    local_18._boList = pBVar2[-1]._boList;
    Lib::BacktrackData::backtrack(&local_18);
  }
  Lib::BacktrackData::backtrack(&this->_queryInitBacktrackData);
  return;
}

Assistant:

void reset() {
        _iterCntr.reset();
        _svStack.reset();
        _nodeIterators.reset();
        _bdStack.reset();
        if(_normalizationRecording) {
          _algo.bdDone();
          _normalizationRecording=false;
          _normalizationBacktrackData.backtrack();
        }
        while(_bdStack.isNonEmpty()) {
          _bdStack.pop().backtrack();
        }
        _queryInitBacktrackData.backtrack();
      }